

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

timestamp_t
duckdb::TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts,interval_t offset)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  date_t input;
  timestamp_t tVar5;
  int iVar6;
  int64_t extraout_RDX;
  int right;
  undefined1 auVar7 [12];
  interval_t iVar8;
  undefined1 auVar9 [16];
  timestamp_t result;
  timestamp_t local_50;
  string local_48;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(ts);
  if (!bVar1) {
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(ts,&local_50,false);
    if (bVar1) {
      return (timestamp_t)local_50.value;
    }
    auVar9 = __cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
              (&local_48,(duckdb *)ts.value,(timestamp_t)auVar9._8_8_);
    InvalidInputException::InvalidInputException(auVar9._0_8_,&local_48);
    __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar8.micros = extraout_RDX;
  iVar8.months = (int)offset.micros;
  iVar8.days = (int)((ulong)offset.micros >> 0x20);
  iVar8 = Interval::Invert(offset._0_8_,iVar8);
  tVar5 = Interval::Add(ts,iVar8);
  iVar2 = EpochMonths<duckdb::timestamp_t>(tVar5);
  right = bucket_width.months;
  iVar6 = (int)(0x168 % (long)right);
  iVar3 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar2,iVar6);
  iVar4 = iVar3 - iVar3 % right;
  if (iVar3 % right != 0 && iVar3 < 0) {
    iVar4 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar4,right);
  }
  iVar4 = iVar4 + iVar6;
  iVar3 = iVar4 % 0xc;
  if (iVar3 == 0 || -1 < iVar4) {
    iVar2 = iVar4 / 0xc + 0x7b2;
    iVar6 = 1;
    if (-1 < iVar4) goto LAB_01a1b0cc;
  }
  else {
    iVar2 = 0x7b1 - (uint)-iVar4 / 0xc;
  }
  iVar6 = 0xd;
  if (iVar3 == 0) {
    iVar6 = 1;
  }
LAB_01a1b0cc:
  input = Date::FromDate(iVar2,iVar6 + iVar3,1);
  bVar1 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input,&local_50,false);
  if (bVar1) {
    tVar5 = Interval::Add(local_50,offset);
    return (timestamp_t)tVar5.value;
  }
  auVar7 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
            (&local_48,(duckdb *)(ulong)(uint)input.days,(date_t)auVar7._8_4_);
  InvalidInputException::InvalidInputException(auVar7._0_8_,&local_48);
  __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(Interval::Add(ts, Interval::Invert(offset)));
			return Interval::Add(Cast::template Operation<date_t, TR>(WidthConvertibleToMonthsCommon(
			                         bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS)),
			                     offset);
		}